

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O3

int __thiscall
CSnapshotDelta::CreateDelta(CSnapshotDelta *this,CSnapshot *pFrom,CSnapshot *pTo,void *pDstData)

{
  short sVar1;
  int iVar2;
  int iVar3;
  undefined1 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  CSnapshot *pCVar8;
  uint *puVar9;
  undefined1 *puVar10;
  long lVar11;
  ushort *puVar12;
  char cVar13;
  undefined4 uVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  long in_FS_OFFSET;
  int aPastIndecies [1024];
  CItemList Hashlist [256];
  
  puVar4 = &stack0xffffffffffffffd0;
  do {
    puVar10 = puVar4;
    *(undefined8 *)(puVar10 + -0x1000) = 0;
    puVar4 = puVar10 + -0x1000;
  } while ((int *)(puVar10 + -0x1000) != aPastIndecies + 0x102);
  *(CSnapshotDelta **)(puVar10 + -0x1420) = this;
  *(undefined8 *)(puVar10 + 0x1fff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  puVar9 = (uint *)((long)pDstData + 0xc);
  *(undefined8 *)pDstData = 0;
  *(undefined4 *)((long)pDstData + 8) = 0;
  *(undefined8 *)(puVar10 + -0x1450) = 0x1ca2e0;
  GenerateHash((CItemList *)(puVar10 + -0x408),pTo);
  iVar17 = pFrom->m_NumItems;
  if (0 < iVar17) {
    lVar6 = 0;
    do {
      lVar11 = (long)iVar17;
      uVar18 = *(uint *)((long)&(pFrom + 1)[lVar11].m_DataSize +
                        (long)(&pFrom[1].m_DataSize)[lVar11 + lVar6]);
      uVar16 = uVar18 & 0xf | uVar18 >> 0xc & 0xf0;
      lVar7 = (ulong)(uVar16 << 9) + (ulong)uVar16 * 4;
      if (0 < (long)*(int *)(puVar10 + lVar7 + -0x408)) {
        lVar19 = 0;
        do {
          if (*(uint *)(puVar10 + lVar19 * 4 + (ulong)(uVar16 << 9) + (ulong)uVar16 * 4 + -0x404) ==
              uVar18) {
            if (*(int *)(puVar10 + lVar19 * 4 + lVar7 + -0x304) != -1) goto LAB_001ca387;
            break;
          }
          lVar19 = lVar19 + 1;
        } while (*(int *)(puVar10 + lVar7 + -0x408) != lVar19);
      }
      *(int *)pDstData = *pDstData + 1;
      *puVar9 = uVar18;
      puVar9 = puVar9 + 1;
      iVar17 = pFrom->m_NumItems;
      lVar11 = (long)iVar17;
LAB_001ca387:
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar11);
  }
  *(undefined8 *)(puVar10 + -0x1450) = 0x1ca3a3;
  GenerateHash((CItemList *)(puVar10 + -0x408),pFrom);
  iVar17 = pTo->m_NumItems;
  lVar6 = (long)iVar17;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      uVar18 = *(uint *)((long)&(pTo + 1)[lVar6].m_DataSize +
                        (long)(&pTo[1].m_DataSize)[lVar6 + lVar7]);
      uVar16 = uVar18 & 0xf | uVar18 >> 0xc & 0xf0;
      lVar11 = (ulong)(uVar16 << 9) + (ulong)uVar16 * 4;
      uVar14 = 0xffffffff;
      if (0 < (long)*(int *)(puVar10 + lVar11 + -0x408)) {
        lVar19 = 0;
        do {
          if (*(uint *)(puVar10 + lVar19 * 4 + (ulong)(uVar16 << 9) + (ulong)uVar16 * 4 + -0x404) ==
              uVar18) {
            uVar14 = *(undefined4 *)(puVar10 + lVar19 * 4 + lVar11 + -0x304);
            break;
          }
          lVar19 = lVar19 + 1;
        } while (*(int *)(puVar10 + lVar11 + -0x408) != lVar19);
      }
      *(undefined4 *)(puVar10 + lVar7 * 4 + -0x1408) = uVar14;
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6);
    if (0 < iVar17) {
      *(CSnapshot **)(puVar10 + -0x1418) = pTo + 1;
      *(CSnapshot **)(puVar10 + -0x1430) = pFrom + 1;
      *(int **)(puVar10 + -0x1428) = &pTo[1].m_NumItems;
      uVar20 = 0;
      *(CSnapshot **)(puVar10 + -0x1438) = pFrom;
      *(long *)(puVar10 + -0x1410) = lVar6;
      do {
        lVar6 = (long)pTo->m_NumItems;
        pCVar8 = (CSnapshot *)(*(long *)(puVar10 + -0x1418) + lVar6 * 4 + 4 + uVar20 * 4);
        iVar17 = pCVar8[-1].m_NumItems;
        lVar7 = (long)iVar17;
        if (uVar20 == pTo->m_NumItems - 1) {
          pCVar8 = pTo;
        }
        iVar17 = pCVar8->m_DataSize - iVar17;
        uVar18 = iVar17 - 4;
        lVar11 = *(long *)(puVar10 + -0x1418) + lVar6 * 4 + lVar6 * 4;
        iVar2 = *(int *)(puVar10 + uVar20 * 4 + -0x1408);
        uVar16 = (uint)*(short *)(lVar7 + 2 + lVar11);
        puVar12 = (ushort *)(lVar11 + lVar7);
        if ((int)uVar16 < 0x40) {
          sVar1 = *(short *)(*(long *)(puVar10 + -0x1420) + (long)(int)uVar16 * 2);
          if (iVar2 != -1) {
            iVar3 = pFrom->m_NumItems;
            puVar10[-0x1439] = sVar1 == 0;
            lVar11 = *(long *)(puVar10 + -0x1430) + (long)iVar3 * 4;
            pFrom = *(CSnapshot **)(puVar10 + -0x1438);
            lVar11 = (long)*(int *)(lVar11 + (long)iVar2 * 4) + lVar11 + (long)iVar3 * 4;
            cVar13 = puVar10[-0x1439];
            puVar15 = puVar9 + 3;
            if (sVar1 != 0) {
              puVar15 = puVar9 + 2;
            }
            goto LAB_001ca545;
          }
          *puVar9 = uVar16;
          puVar9[1] = (uint)*puVar12;
          if (sVar1 == 0) goto LAB_001ca5e7;
          puVar9 = puVar9 + 2;
          uVar16 = iVar17 - 1;
          if (-1 < (int)uVar18) {
            uVar16 = uVar18;
          }
          uVar16 = (int)uVar16 >> 2;
LAB_001ca5fd:
          *(undefined8 *)(puVar10 + -0x1450) = 0x1ca609;
          mem_copy(puVar9,puVar12 + 2,uVar18);
LAB_001ca609:
          puVar9 = puVar9 + (int)uVar16;
          *(int *)((long)pDstData + 4) = *(int *)((long)pDstData + 4) + 1;
        }
        else {
          if (iVar2 == -1) {
            *puVar9 = uVar16;
            puVar9[1] = (uint)*puVar12;
LAB_001ca5e7:
            uVar16 = iVar17 - 1;
            if (-1 < (int)uVar18) {
              uVar16 = uVar18;
            }
            uVar16 = (int)uVar16 >> 2;
            puVar9[2] = uVar16;
            puVar9 = puVar9 + 3;
            goto LAB_001ca5fd;
          }
          lVar11 = *(long *)(puVar10 + -0x1430) + (long)pFrom->m_NumItems * 4;
          lVar11 = (long)*(int *)(lVar11 + (long)iVar2 * 4) + lVar11 + (long)pFrom->m_NumItems * 4;
          cVar13 = '\x01';
          puVar15 = puVar9 + 3;
LAB_001ca545:
          uVar16 = iVar17 - 1;
          if (-1 < (int)uVar18) {
            uVar16 = uVar18;
          }
          if (6 < iVar17 - 1U) {
            uVar16 = (int)uVar16 >> 2;
            lVar19 = *(long *)(puVar10 + -0x1428);
            lVar5 = 0;
            uVar18 = 0;
            do {
              uVar21 = *(int *)(lVar7 + lVar6 * 8 + lVar19 + lVar5 * 4) -
                       *(int *)(lVar11 + 4 + lVar5 * 4);
              puVar15[lVar5] = uVar21;
              uVar18 = uVar18 | uVar21;
              lVar5 = lVar5 + 1;
            } while (uVar16 != (uint)lVar5);
            if (uVar18 == 0) {
              pFrom = *(CSnapshot **)(puVar10 + -0x1438);
              goto LAB_001ca614;
            }
            *puVar9 = (int)(short)puVar12[1];
            puVar9[1] = (uint)*puVar12;
            lVar6 = 8;
            pFrom = *(CSnapshot **)(puVar10 + -0x1438);
            if (cVar13 != '\0') {
              puVar9[2] = uVar16;
              lVar6 = 0xc;
            }
            puVar9 = (uint *)((long)puVar9 + lVar6);
            goto LAB_001ca609;
          }
        }
LAB_001ca614:
        uVar20 = uVar20 + 1;
      } while (uVar20 != *(ulong *)(puVar10 + -0x1410));
    }
  }
  if (((*pDstData == 0) && (*(int *)((long)pDstData + 4) == 0)) &&
     (*(int *)((long)pDstData + 8) == 0)) {
    iVar17 = 0;
  }
  else {
    iVar17 = (int)puVar9 - (int)pDstData;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar10 + 0x1fff8)) {
    *(code **)(puVar10 + -0x1450) = GenerateHash;
    __stack_chk_fail();
  }
  return iVar17;
}

Assistant:

int CSnapshotDelta::CreateDelta(const CSnapshot *pFrom, CSnapshot *pTo, void *pDstData)
{
	CData *pDelta = (CData *)pDstData;
	int *pData = (int *)pDelta->m_pData;
	int i, ItemSize, PastIndex;
	const CSnapshotItem *pFromItem;
	const CSnapshotItem *pCurItem;
	const CSnapshotItem *pPastItem;
	int SizeCount = 0;

	pDelta->m_NumDeletedItems = 0;
	pDelta->m_NumUpdateItems = 0;
	pDelta->m_NumTempItems = 0;

	CItemList Hashlist[HASHLIST_SIZE];
	GenerateHash(Hashlist, pTo);

	// pack deleted stuff
	for(i = 0; i < pFrom->NumItems(); i++)
	{
		pFromItem = pFrom->GetItem(i);
		if(GetItemIndexHashed(pFromItem->Key(), Hashlist) == -1)
		{
			// deleted
			pDelta->m_NumDeletedItems++;
			*pData = pFromItem->Key();
			pData++;
		}
	}

	GenerateHash(Hashlist, pFrom);
	int aPastIndecies[1024];

	// fetch previous indices
	// we do this as a separate pass because it helps the cache
	const int NumItems = pTo->NumItems();
	for(i = 0; i < NumItems; i++)
	{
		pCurItem = pTo->GetItem(i); // O(1) .. O(n)
		aPastIndecies[i] = GetItemIndexHashed(pCurItem->Key(), Hashlist); // O(n) .. O(n^n)
	}

	for(i = 0; i < NumItems; i++)
	{
		// do delta
		ItemSize = pTo->GetItemSize(i); // O(1) .. O(n)
		pCurItem = pTo->GetItem(i); // O(1) .. O(n)
		PastIndex = aPastIndecies[i];

		bool IncludeSize = pCurItem->Type() >= MAX_NETOBJSIZES || !m_aItemSizes[pCurItem->Type()];

		if(PastIndex != -1)
		{
			int *pItemDataDst = pData+3;

			pPastItem = pFrom->GetItem(PastIndex);

			if(!IncludeSize)
				pItemDataDst = pData+2;

			if(DiffItem(pPastItem->Data(), (int*)pCurItem->Data(), pItemDataDst, ItemSize/4))
			{

				*pData++ = pCurItem->Type();
				*pData++ = pCurItem->ID();
				if(IncludeSize)
					*pData++ = ItemSize/4;
				pData += ItemSize/4;
				pDelta->m_NumUpdateItems++;
			}
		}
		else
		{
			*pData++ = pCurItem->Type();
			*pData++ = pCurItem->ID();
			if(IncludeSize)
				*pData++ = ItemSize/4;

			mem_copy(pData, pCurItem->Data(), ItemSize);
			SizeCount += ItemSize;
			pData += ItemSize/4;
			pDelta->m_NumUpdateItems++;
		}
	}

	if(0)
	{
		dbg_msg("snapshot", "%d %d %d",
			pDelta->m_NumDeletedItems,
			pDelta->m_NumUpdateItems,
			pDelta->m_NumTempItems);
	}

	/*
	// TODO: pack temp stuff

	// finish
	//mem_copy(pDelta->offsets, deleted, pDelta->num_deleted_items*sizeof(int));
	//mem_copy(&(pDelta->offsets[pDelta->num_deleted_items]), update, pDelta->num_update_items*sizeof(int));
	//mem_copy(&(pDelta->offsets[pDelta->num_deleted_items+pDelta->num_update_items]), temp, pDelta->num_temp_items*sizeof(int));
	//mem_copy(pDelta->data_start(), data, data_size);
	//pDelta->data_size = data_size;
	* */

	if(!pDelta->m_NumDeletedItems && !pDelta->m_NumUpdateItems && !pDelta->m_NumTempItems)
		return 0;

	return (int)((char*)pData-(char*)pDstData);
}